

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_fast.c
# Opt level: O0

block_state deflate_fast(deflate_state *s,int flush)

{
  Pos PVar1;
  long lVar2;
  int in_ESI;
  deflate_state *in_RDI;
  uint32_t match_len;
  int64_t dist;
  int bflush;
  Pos hash_head;
  undefined8 in_stack_ffffffffffffffa8;
  uint32_t str;
  deflate_state *in_stack_ffffffffffffffb0;
  deflate_state *strm;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  uint uVar3;
  deflate_state *in_stack_ffffffffffffffc0;
  uint local_2c;
  int local_1c;
  
  local_2c = 0;
  do {
    if (in_RDI->lookahead < 0x106) {
      zng_fill_window(in_stack_ffffffffffffffb0);
      if (in_RDI->lookahead < 0x106 && in_ESI == 0) {
        return need_more;
      }
      if (in_RDI->lookahead == 0) {
        if (in_RDI->strstart < 2) {
          uVar3 = in_RDI->strstart;
        }
        else {
          uVar3 = 2;
        }
        in_RDI->insert = uVar3;
        if (in_ESI != 4) {
          if (in_RDI->sym_next != 0) {
            zng_tr_flush_block(in_stack_ffffffffffffffc0,
                               (char *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),
                               (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                               (int)in_stack_ffffffffffffffb0);
            in_RDI->block_start = in_RDI->strstart;
            zng_flush_pending((zng_stream *)in_stack_ffffffffffffffb0);
            if (in_RDI->strm->avail_out == 0) {
              return need_more;
            }
          }
          return block_done;
        }
        strm = in_RDI;
        zng_tr_flush_block(in_stack_ffffffffffffffc0,
                           (char *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),
                           (uint32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
        in_RDI->block_start = in_RDI->strstart;
        zng_flush_pending((zng_stream *)strm);
        if (in_RDI->strm->avail_out == 0) {
          return finish_started;
        }
        return finish_done;
      }
    }
    str = (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    if (3 < in_RDI->lookahead) {
      PVar1 = quick_insert_string(in_stack_ffffffffffffffb0,str);
      lVar2 = (ulong)in_RDI->strstart - (ulong)PVar1;
      if (((lVar2 <= (long)(ulong)(in_RDI->w_size - 0x106)) && (0 < lVar2)) && (PVar1 != 0)) {
        local_2c = (*functable.longest_match)(in_RDI,PVar1);
      }
    }
    if (local_2c < 4) {
      local_1c = zng_tr_tally_lit(in_RDI,in_RDI->window[in_RDI->strstart]);
      in_RDI->lookahead = in_RDI->lookahead - 1;
      in_RDI->strstart = in_RDI->strstart + 1;
    }
    else {
      local_1c = zng_tr_tally_dist(in_RDI,in_RDI->strstart - in_RDI->match_start,local_2c - 3);
      in_RDI->lookahead = in_RDI->lookahead - local_2c;
      if ((in_RDI->max_lazy_match < local_2c) || (in_RDI->lookahead < 4)) {
        in_RDI->strstart = local_2c + in_RDI->strstart;
        quick_insert_string(in_stack_ffffffffffffffb0,str);
      }
      else {
        in_RDI->strstart = in_RDI->strstart + 1;
        insert_string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
        ;
        in_RDI->strstart = (local_2c - 1) + in_RDI->strstart;
      }
      local_2c = 0;
    }
    if (local_1c != 0) {
      if (in_RDI->block_start < 0) {
        in_stack_ffffffffffffffc0 = (deflate_state *)0x0;
      }
      else {
        in_stack_ffffffffffffffc0 = (deflate_state *)(in_RDI->window + (uint)in_RDI->block_start);
      }
      zng_tr_flush_block(in_stack_ffffffffffffffc0,
                         (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                         (int)in_stack_ffffffffffffffb0);
      in_RDI->block_start = in_RDI->strstart;
      zng_flush_pending((zng_stream *)in_stack_ffffffffffffffb0);
      if (in_RDI->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_fast(deflate_state *s, int flush) {
    Pos hash_head;        /* head of the hash chain */
    int bflush = 0;       /* set if current block must be flushed */
    int64_t dist;
    uint32_t match_len = 0;

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (UNLIKELY(s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH)) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= WANT_MIN_MATCH) {
            hash_head = quick_insert_string(s, s->strstart);
            dist = (int64_t)s->strstart - hash_head;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match length < WANT_MIN_MATCH
             */
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                match_len = FUNCTABLE_CALL(longest_match)(s, hash_head);
                /* longest_match() sets match_start */
            }
        }

        if (match_len >= WANT_MIN_MATCH) {
            Assert(s->strstart <= UINT16_MAX, "strstart should fit in uint16_t");
            Assert(s->match_start <= UINT16_MAX, "match_start should fit in uint16_t");
            check_match(s, (Pos)s->strstart, (Pos)s->match_start, match_len);

            bflush = zng_tr_tally_dist(s, s->strstart - s->match_start, match_len - STD_MIN_MATCH);

            s->lookahead -= match_len;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
            if (match_len <= s->max_insert_length && s->lookahead >= WANT_MIN_MATCH) {
                match_len--; /* string at strstart already in table */
                s->strstart++;

                insert_string(s, s->strstart, match_len);
                s->strstart += match_len;
            } else {
                s->strstart += match_len;
                quick_insert_string(s, s->strstart + 2 - STD_MIN_MATCH);

                /* If lookahead < STD_MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
            match_len = 0;
        } else {
            /* No match, output a literal byte */
            bflush = zng_tr_tally_lit(s, s->window[s->strstart]);
            s->lookahead--;
            s->strstart++;
        }
        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (UNLIKELY(flush == Z_FINISH)) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);
    return block_done;
}